

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_test.cpp
# Opt level: O0

int __thiscall QuadDrawer::init(QuadDrawer *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  stbi_uc *retval_from_stbi_load;
  ostream *this_00;
  uchar *data;
  int local_18;
  int nrChannels;
  int height;
  int width;
  QuadDrawer *this_local;
  
  _height = this;
  glEnable(0xde1);
  glGenTextures(1,&texture);
  glBindTexture(0xde1,texture);
  glTexParameteri(0xde1,0x2802,0x2901);
  glTexParameteri(0xde1,0x2803,0x2901);
  glTexParameteri(0xde1,0x2801,0x2600);
  glTexParameteri(0xde1,0x2800,0x2600);
  retval_from_stbi_load = stbi_load("../wall.jpg",&nrChannels,&local_18,(int *)((long)&data + 4),0);
  if (retval_from_stbi_load == (stbi_uc *)0x0) {
    this_00 = std::operator<<((ostream *)&std::cout,"Failed to load texture");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    glTexImage2D(0xde1,0,0x1907,nrChannels,local_18,0,0x1907,0x1401,retval_from_stbi_load);
    (*__glewGenerateMipmap)(0xde1);
  }
  stbi_image_free(retval_from_stbi_load);
  return extraout_EAX;
}

Assistant:

void init() {
    glEnable(GL_TEXTURE_2D);
    glGenTextures(1, &texture);
    glBindTexture(GL_TEXTURE_2D, texture);
    // set the texture wrapping/filtering options (on the currently bound texture object)
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
    
    /*TODO: Change GL_NEAREST, and compare the effects of the following filters.
      The following are the following potential filter options:
      GL_LINEAR
      GL_NEAREST_MIPMAP_NEAREST
      GL_LINEAR_MIPMAP_NEAREST
      GL_NEAREST_MIPMAP_LINEAR
      GL_LINEAR_MIPMAP_LINEAR
     */
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
    // load and generate the texture
    int width, height, nrChannels;
    //TODO: (optional) Change the picture here!
#ifdef _MSC_VER
    unsigned char* data = stbi_load("../../../wall.jpg", &width, &height, &nrChannels, 0);
#else
    unsigned char* data = stbi_load("../wall.jpg", &width, &height, &nrChannels, 0);
#endif
    if (data)
    {
    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, width, height, 0, GL_RGB, GL_UNSIGNED_BYTE, data);
    glGenerateMipmap(GL_TEXTURE_2D);
    }
    else
    {
    std::cout << "Failed to load texture" << std::endl;
    }
    stbi_image_free(data);
    return;
  }